

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runner.cpp
# Opt level: O0

void __thiscall TestRunner::~TestRunner(TestRunner *this)

{
  ostream *poVar1;
  TestRunner *this_local;
  
  if (0 < this->fail_count) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,this->fail_count);
    poVar1 = std::operator<<(poVar1," unit tests failed. Terminate");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  return;
}

Assistant:

TestRunner::~TestRunner() {
    if (fail_count > 0) {
        std::cerr << fail_count << " unit tests failed. Terminate" << std::endl;
        exit(1);
    }
}